

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

Vec_Int_t * Dtt_ManCollect(Dtt_Man_t *p,uint Truth,Vec_Int_t *vFuns)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint *puVar4;
  byte bVar5;
  int iVar6;
  uint Truth_00;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  vFuns->nSize = 0;
  iVar6 = p->nPerms;
  if (0 < iVar6) {
    uVar7 = (ulong)(uint)p->nComps;
    lVar8 = 0;
    uVar10 = CONCAT44(Truth,Truth);
    do {
      if (0 < (int)uVar7) {
        lVar9 = 0;
        do {
          Truth_00 = -(uint)((p->CmpMask & (uint)uVar10) != 0) ^ (uint)uVar10;
          iVar6 = Dtt_ManCheckHash(p,Truth_00);
          if (iVar6 != 0) {
            Vec_IntPush(vFuns,Truth_00);
          }
          bVar5 = (byte)(1L << ((byte)p->pComps[lVar9] & 0x3f));
          uVar10 = (s_Truths6[p->pComps[lVar9]] & uVar10) >> (bVar5 & 0x3f) |
                   uVar10 << (bVar5 & 0x3f) & s_Truths6[p->pComps[lVar9]];
          lVar9 = lVar9 + 1;
          uVar7 = (ulong)p->nComps;
        } while (lVar9 < (long)uVar7);
        iVar6 = p->nPerms;
      }
      iVar1 = p->pPerms[lVar8];
      bVar5 = (byte)(1L << ((byte)iVar1 & 0x3f));
      uVar10 = (uVar10 & s_PMasks[iVar1][2]) >> (bVar5 & 0x3f) |
               (s_PMasks[iVar1][1] & uVar10) << (bVar5 & 0x3f) | s_PMasks[iVar1][0] & uVar10;
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
    if (uVar10 != CONCAT44(Truth,Truth)) {
      __assert_fail("tCur == (((word)Truth << 32) | (word)Truth)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0x1fc,"Vec_Int_t *Dtt_ManCollect(Dtt_Man_t *, unsigned int, Vec_Int_t *)");
    }
  }
  pVVar2 = p->vUsedBins;
  if (0 < pVVar2->nSize) {
    piVar3 = pVVar2->pArray;
    puVar4 = p->pBins;
    lVar8 = 0;
    do {
      puVar4[piVar3[lVar8]] = 0xffffffff;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  pVVar2->nSize = 0;
  return vFuns;
}

Assistant:

Vec_Int_t * Dtt_ManCollect( Dtt_Man_t * p, unsigned Truth, Vec_Int_t * vFuns )
{
    int i, k, Entry;
    word tCur = ((word)Truth << 32) | (word)Truth;
    Vec_IntClear( vFuns );
    for ( i = 0; i < p->nPerms; i++ )
    {
        for ( k = 0; k < p->nComps; k++ )
        {
//            unsigned tTemp = (unsigned)(tCur & 1 ? ~tCur : tCur);
            unsigned tTemp = (unsigned)(tCur & p->CmpMask ? ~tCur : tCur);
            if ( Dtt_ManCheckHash( p, tTemp ) )
                Vec_IntPush( vFuns, tTemp );
            tCur = Abc_Tt6Flip( tCur, p->pComps[k] );
        }
        tCur = Abc_Tt6SwapAdjacent( tCur, p->pPerms[i] );
    }
    assert( tCur == (((word)Truth << 32) | (word)Truth) );
    // clean hash table
    Vec_IntForEachEntry( p->vUsedBins, Entry, i )
        p->pBins[Entry] = ~0;
    Vec_IntClear( p->vUsedBins );
    //printf( "%d ", Vec_IntSize(vFuns) );
    return vFuns;
}